

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

MethodOptions * __thiscall
google::protobuf::MethodDescriptorProto::_internal_mutable_options(MethodDescriptorProto *this)

{
  ulong uVar1;
  MethodOptions *pMVar2;
  Arena *arena;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
  if (this->options_ != (MethodOptions *)0x0) {
    return this->options_;
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pMVar2 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(arena);
  this->options_ = pMVar2;
  return pMVar2;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::MethodOptions* MethodDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000008u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<::PROTOBUF_NAMESPACE_ID::MethodOptions>(GetArenaForAllocation());
    options_ = p;
  }
  return options_;
}